

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_zip.c
# Opt level: O0

mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip,mz_uint64 cur_file_ofs,mz_uint32 n)

{
  size_t sVar1;
  size_t local_1048;
  size_t local_1040;
  undefined1 local_1028 [4];
  mz_uint32 s;
  char buf [4096];
  mz_uint64 mStack_20;
  mz_uint32 n_local;
  mz_uint64 cur_file_ofs_local;
  mz_zip_archive *pZip_local;
  
  if (n < 0x1001) {
    local_1040 = (size_t)n;
  }
  else {
    local_1040 = 0x1000;
  }
  buf._4092_4_ = n;
  memset(local_1028,0,local_1040);
  mStack_20 = cur_file_ofs;
  while( true ) {
    if (buf._4092_4_ == 0) {
      return 1;
    }
    if ((uint)buf._4092_4_ < 0x1001) {
      local_1048 = (size_t)(uint)buf._4092_4_;
    }
    else {
      local_1048 = 0x1000;
    }
    sVar1 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mStack_20,local_1028,local_1048);
    if (sVar1 != local_1048) break;
    mStack_20 = local_1048 + mStack_20;
    buf._4092_4_ = buf._4092_4_ - (int)local_1048;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip, mz_uint64 cur_file_ofs, mz_uint32 n)
{
    char buf[4096];
    memset(buf, 0, MZ_MIN(sizeof(buf), n));
    while (n)
    {
        mz_uint32 s = MZ_MIN(sizeof(buf), n);
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_file_ofs, buf, s) != s)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_file_ofs += s;
        n -= s;
    }
    return MZ_TRUE;
}